

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btMLCPSolver.cpp
# Opt level: O3

void __thiscall btMLCPSolver::createMLCPFast(btMLCPSolver *this,btContactSolverInfo *infoGlobal)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  btMatrixXf *this_00;
  float fVar3;
  float fVar4;
  float fVar5;
  undefined8 uVar6;
  btSolverConstraint **ppbVar7;
  float *pfVar8;
  float *pfVar9;
  btSolverConstraint *pbVar10;
  btSolverBody *pbVar11;
  btRigidBody *pbVar12;
  btRigidBody *pbVar13;
  btContactSolverInfo *pbVar14;
  uint uVar15;
  uint uVar16;
  int *piVar17;
  btJointNode *pbVar18;
  int *piVar19;
  int iVar20;
  int iVar21;
  ulong uVar22;
  long lVar23;
  btJointNode *pbVar24;
  long lVar25;
  ulong uVar26;
  int iVar27;
  long lVar28;
  int iVar29;
  uint uVar30;
  long lVar31;
  ulong uVar32;
  long lVar33;
  long lVar34;
  btMLCPSolver *pbVar35;
  btScalar *pbVar36;
  btScalar *C;
  long lVar37;
  uint uVar38;
  btAlignedObjectArray<btJointNode> jointNodeArray;
  btAlignedObjectArray<int> bodyJointNodeArray;
  btVector3 relPosCrossNormalInvInertia;
  btVector3 normalInvMass;
  btAlignedObjectArray<btJointNode> local_f0;
  float *local_d0;
  long local_c8;
  float *local_c0;
  long local_b8;
  long local_b0;
  btMLCPSolver *local_a8;
  ulong local_a0;
  btAlignedObjectArray<int> local_98;
  ulong local_78;
  int local_70;
  int local_6c;
  int local_68;
  int local_64;
  long local_60;
  btContactSolverInfo *local_58;
  undefined1 local_50 [16];
  undefined1 local_40 [16];
  
  uVar38 = (uint)interleaveContactAndFriction;
  uVar15 = (this->m_allConstraintPtrArray).m_size;
  uVar22 = (ulong)uVar15;
  CProfileManager::Start_Profile("init b (rhs)");
  btVectorX<float>::resize(&this->m_b,uVar15);
  btVectorX<float>::resize(&this->m_bSplit,uVar15);
  lVar25 = (long)(this->m_b).m_storage.m_size;
  if (lVar25 != 0) {
    memset((this->m_b).m_storage.m_data,0,lVar25 << 2);
  }
  lVar25 = (long)(this->m_bSplit).m_storage.m_size;
  if (lVar25 != 0) {
    memset((this->m_bSplit).m_storage.m_data,0,lVar25 << 2);
  }
  if (0 < (int)uVar15) {
    ppbVar7 = (this->m_allConstraintPtrArray).m_data;
    pfVar8 = (this->m_b).m_storage.m_data;
    pfVar9 = (this->m_bSplit).m_storage.m_data;
    uVar26 = 0;
    do {
      pbVar10 = ppbVar7[uVar26];
      fVar3 = pbVar10->m_jacDiagABInv;
      if (1.1920929e-07 <= ABS(fVar3)) {
        fVar4 = pbVar10->m_rhsPenetration;
        pfVar8[uVar26] = pbVar10->m_rhs / fVar3;
        pfVar9[uVar26] = fVar4 / fVar3;
      }
      uVar26 = uVar26 + 1;
    } while (uVar22 != uVar26);
  }
  CProfileManager::Stop_Profile();
  btVectorX<float>::resize(&this->m_lo,uVar15);
  btVectorX<float>::resize(&this->m_hi,uVar15);
  CProfileManager::Start_Profile("init lo/ho");
  if (0 < (int)uVar15) {
    ppbVar7 = (this->m_allConstraintPtrArray).m_data;
    pfVar8 = (this->m_lo).m_storage.m_data;
    pfVar9 = (this->m_hi).m_storage.m_data;
    uVar26 = 0;
    do {
      pbVar10 = ppbVar7[uVar26];
      pfVar8[uVar26] = pbVar10->m_lowerLimit;
      pfVar9[uVar26] = pbVar10->m_upperLimit;
      uVar26 = uVar26 + 1;
    } while (uVar22 != uVar26);
  }
  CProfileManager::Stop_Profile();
  iVar20 = (this->m_allConstraintPtrArray).m_size;
  iVar29 = (this->super_btSequentialImpulseConstraintSolver).m_tmpSolverBodyPool.m_size;
  local_98.m_ownsMemory = true;
  local_98.m_data = (int *)0x0;
  local_98.m_size = 0;
  local_98.m_capacity = 0;
  local_a0 = uVar22;
  local_58 = infoGlobal;
  CProfileManager::Start_Profile("bodyJointNodeArray.resize");
  iVar21 = local_98.m_size;
  local_a8 = this;
  if (local_98.m_size < iVar29) {
    if (local_98.m_capacity < iVar29) {
      if (iVar29 == 0) {
        piVar17 = (int *)0x0;
      }
      else {
        piVar17 = (int *)btAlignedAllocInternal((long)iVar29 * 4,0x10);
      }
      if (local_98.m_size < 1) {
        if (local_98.m_data != (int *)0x0) goto LAB_001ce994;
      }
      else {
        uVar22 = 0;
        do {
          piVar17[uVar22] = local_98.m_data[uVar22];
          uVar22 = uVar22 + 1;
        } while ((uint)local_98.m_size != uVar22);
LAB_001ce994:
        if (local_98.m_ownsMemory == true) {
          btAlignedFreeInternal(local_98.m_data);
        }
      }
      local_98.m_ownsMemory = true;
      local_98.m_capacity = iVar29;
      local_98.m_data = piVar17;
    }
    memset(local_98.m_data + iVar21,0xff,((long)iVar29 - (long)iVar21) * 4);
  }
  pbVar35 = local_a8;
  local_98.m_size = iVar29;
  CProfileManager::Stop_Profile();
  local_f0.m_ownsMemory = true;
  local_f0.m_data = (btJointNode *)0x0;
  local_f0.m_size = 0;
  local_f0.m_capacity = 0;
  CProfileManager::Start_Profile("jointNodeArray.reserve");
  uVar22 = local_a0;
  iVar21 = (int)local_a0;
  iVar29 = (pbVar35->m_allConstraintPtrArray).m_size;
  if (local_f0.m_capacity < iVar29 * 2) {
    if (iVar29 == 0) {
      pbVar18 = (btJointNode *)0x0;
    }
    else {
      pbVar18 = (btJointNode *)btAlignedAllocInternal((long)iVar29 << 5,0x10);
    }
    if ((long)local_f0.m_size < 1) {
      if (local_f0.m_data != (btJointNode *)0x0) goto LAB_001cea65;
    }
    else {
      lVar25 = 0;
      do {
        puVar1 = (undefined8 *)((long)&(local_f0.m_data)->jointIndex + lVar25);
        uVar6 = puVar1[1];
        puVar2 = (undefined8 *)((long)&pbVar18->jointIndex + lVar25);
        *puVar2 = *puVar1;
        puVar2[1] = uVar6;
        lVar25 = lVar25 + 0x10;
      } while ((long)local_f0.m_size * 0x10 != lVar25);
LAB_001cea65:
      if (local_f0.m_ownsMemory == true) {
        btAlignedFreeInternal(local_f0.m_data);
      }
    }
    local_f0.m_ownsMemory = true;
    local_f0.m_data = pbVar18;
    local_f0.m_capacity = iVar29 * 2;
  }
  CProfileManager::Stop_Profile();
  if (createMLCPFast(btContactSolverInfo_const&)::J3 == '\0') {
    createMLCPFast();
  }
  CProfileManager::Start_Profile("J3.resize");
  iVar20 = iVar20 * 2;
  btMatrixX<float>::resize(&createMLCPFast::J3,iVar20,8);
  CProfileManager::Stop_Profile();
  if (createMLCPFast(btContactSolverInfo_const&)::JinvM3 == '\0') {
    createMLCPFast();
  }
  CProfileManager::Start_Profile("JinvM3.resize/setZero");
  btMatrixX<float>::resize(&createMLCPFast::JinvM3,iVar20,8);
  btMatrixX<float>::setZero(&createMLCPFast::JinvM3);
  btMatrixX<float>::setZero(&createMLCPFast::J3);
  CProfileManager::Stop_Profile();
  if (createMLCPFast(btContactSolverInfo_const&)::ofs == '\0') {
    createMLCPFast();
  }
  CProfileManager::Start_Profile("ofs resize");
  lVar25 = (long)createMLCPFast::ofs.m_size;
  if (lVar25 < 0) {
    piVar17 = createMLCPFast::ofs.m_data;
    if (createMLCPFast::ofs.m_capacity < 0) {
      if (createMLCPFast::ofs.m_data != (int *)0x0) {
        if (createMLCPFast::ofs.m_ownsMemory == true) {
          btAlignedFreeInternal(createMLCPFast::ofs.m_data);
        }
        createMLCPFast::ofs.m_data = (int *)0x0;
      }
      createMLCPFast::ofs.m_ownsMemory = true;
      createMLCPFast::ofs.m_capacity = 0;
      piVar17 = (int *)0x0;
    }
    memset(piVar17 + lVar25,0,lVar25 * -4);
  }
  createMLCPFast::ofs.m_size = 0;
  iVar20 = (pbVar35->m_allConstraintPtrArray).m_size;
  if (((long)iVar20 < 1) || (iVar20 <= createMLCPFast::ofs.m_capacity)) goto LAB_001cec07;
  piVar19 = (int *)btAlignedAllocInternal((long)iVar20 << 2,0x10);
  piVar17 = createMLCPFast::ofs.m_data;
  lVar25 = (long)createMLCPFast::ofs.m_size;
  if (lVar25 < 1) {
    if (createMLCPFast::ofs.m_data != (int *)0x0) goto LAB_001cebe5;
  }
  else {
    lVar23 = 0;
    do {
      piVar19[lVar23] = piVar17[lVar23];
      lVar23 = lVar23 + 1;
    } while (lVar25 != lVar23);
LAB_001cebe5:
    if (createMLCPFast::ofs.m_ownsMemory == true) {
      btAlignedFreeInternal(piVar17);
    }
  }
  createMLCPFast::ofs.m_ownsMemory = true;
  createMLCPFast::ofs.m_capacity = iVar20;
  createMLCPFast::ofs.m_data = piVar19;
LAB_001cec07:
  createMLCPFast::ofs.m_size = iVar20;
  CProfileManager::Stop_Profile();
  CProfileManager::Start_Profile("Compute J and JinvM");
  uVar15 = uVar38 * 2 + 1;
  if (0 < (pbVar35->m_allConstraintPtrArray).m_size) {
    lVar25 = 0;
    uVar26 = 0;
    iVar20 = 0;
    iVar29 = 0;
    do {
      iVar21 = local_f0.m_size;
      createMLCPFast::ofs.m_data[lVar25] = iVar20;
      uVar38 = uVar15;
      if (iVar29 < (pbVar35->super_btSequentialImpulseConstraintSolver).
                   m_tmpSolverNonContactConstraintPool.m_size) {
        uVar38 = (pbVar35->super_btSequentialImpulseConstraintSolver).m_tmpConstraintSizesPool.
                 m_data[lVar25].m_numConstraintRows;
      }
      local_78 = (ulong)uVar38;
      local_60 = (long)iVar29;
      pbVar10 = (pbVar35->m_allConstraintPtrArray).m_data[local_60];
      lVar23 = (long)pbVar10->m_solverBodyIdA;
      lVar34 = (long)pbVar10->m_solverBodyIdB;
      pbVar11 = (pbVar35->super_btSequentialImpulseConstraintSolver).m_tmpSolverBodyPool.m_data;
      pbVar12 = pbVar11[lVar23].m_originalBody;
      pbVar13 = pbVar11[lVar34].m_originalBody;
      local_d0 = (float *)lVar25;
      local_64 = iVar20;
      if (pbVar12 == (btRigidBody *)0x0) {
        uVar26 = (ulong)((int)uVar26 + uVar38);
      }
      else {
        if (local_f0.m_size == local_f0.m_capacity) {
          uVar38 = local_f0.m_size * 2;
          if (local_f0.m_size == 0) {
            uVar38 = 1;
          }
          if (local_f0.m_size < (int)uVar38) {
            local_b8 = lVar34;
            local_b0 = lVar23;
            if (uVar38 == 0) {
              pbVar18 = (btJointNode *)0x0;
            }
            else {
              pbVar18 = (btJointNode *)btAlignedAllocInternal((long)(int)uVar38 << 4,0x10);
            }
            if (local_f0.m_size < 1) {
              if (local_f0.m_data != (btJointNode *)0x0) goto LAB_001ced65;
            }
            else {
              lVar25 = 0;
              do {
                puVar1 = (undefined8 *)((long)&(local_f0.m_data)->jointIndex + lVar25);
                uVar6 = puVar1[1];
                puVar2 = (undefined8 *)((long)&pbVar18->jointIndex + lVar25);
                *puVar2 = *puVar1;
                puVar2[1] = uVar6;
                lVar25 = lVar25 + 0x10;
              } while ((ulong)(uint)local_f0.m_size << 4 != lVar25);
LAB_001ced65:
              if (local_f0.m_ownsMemory == true) {
                btAlignedFreeInternal(local_f0.m_data);
              }
            }
            local_f0.m_ownsMemory = true;
            lVar23 = local_b0;
            lVar34 = local_b8;
            uVar22 = local_a0;
            local_f0.m_data = pbVar18;
            local_f0.m_capacity = uVar38;
          }
        }
        lVar25 = (long)iVar21;
        local_f0.m_size = local_f0.m_size + 1;
        pbVar18 = local_f0.m_data + lVar25;
        pbVar18->jointIndex = 0;
        pbVar18->otherBodyIndex = 0;
        pbVar18->nextJointNodeIndex = 0;
        pbVar18->constraintRowIndex = 0;
        iVar20 = local_98.m_data[lVar23];
        local_98.m_data[lVar23] = iVar21;
        local_f0.m_data[lVar25].nextJointNodeIndex = iVar20;
        local_f0.m_data[lVar25].jointIndex = (int)local_d0;
        local_f0.m_data[lVar25].constraintRowIndex = iVar29;
        local_f0.m_data[lVar25].otherBodyIndex =
             -(uint)(pbVar13 == (btRigidBody *)0x0) | (uint)lVar34;
        pfVar9 = createMLCPFast::JinvM3.m_storage.m_data;
        pfVar8 = createMLCPFast::J3.m_storage.m_data;
        if (0 < (int)local_78) {
          local_68 = createMLCPFast::JinvM3.m_setElemOperations;
          lVar28 = (long)createMLCPFast::J3.m_cols;
          lVar25 = (long)createMLCPFast::JinvM3.m_cols;
          uVar26 = (ulong)(int)uVar26;
          local_70 = (int)local_78 * 8;
          createMLCPFast::J3.m_setElemOperations = createMLCPFast::J3.m_setElemOperations + local_70
          ;
          local_c0 = (float *)(local_78 & 0xffffffff);
          ppbVar7 = (pbVar35->m_allConstraintPtrArray).m_data;
          lVar37 = (long)createMLCPFast::JinvM3.m_storage.m_data + uVar26 * 4 * lVar25 + 0x10;
          local_c8 = lVar25 * 4;
          lVar31 = (long)createMLCPFast::J3.m_storage.m_data + uVar26 * 4 * lVar28 + 0x10;
          uVar22 = 0;
          do {
            pbVar10 = ppbVar7[local_60 + uVar22];
            fVar3 = pbVar12->m_inverseMass;
            uVar6 = *(undefined8 *)(pbVar10->m_contactNormal1).m_floats;
            local_40._4_4_ = fVar3 * (float)((ulong)uVar6 >> 0x20);
            local_40._0_4_ = fVar3 * (float)uVar6;
            local_40._8_4_ = fVar3 * (pbVar10->m_contactNormal1).m_floats[2];
            local_40._12_4_ = 0;
            fVar3 = (pbVar10->m_relpos1CrossNormal).m_floats[0];
            fVar4 = (pbVar10->m_relpos1CrossNormal).m_floats[1];
            fVar5 = (pbVar10->m_relpos1CrossNormal).m_floats[2];
            uVar6 = *(undefined8 *)&(pbVar12->super_btCollisionObject).field_0x14c;
            local_50._4_4_ =
                 fVar5 * (float)((ulong)*(undefined8 *)&pbVar12->field_0x16c >> 0x20) +
                 fVar3 * (float)((ulong)uVar6 >> 0x20) +
                 (float)((ulong)*(undefined8 *)&pbVar12->field_0x15c >> 0x20) * fVar4;
            local_50._0_4_ =
                 fVar5 * (float)*(undefined8 *)&pbVar12->field_0x16c +
                 fVar3 * (float)uVar6 + (float)*(undefined8 *)&pbVar12->field_0x15c * fVar4;
            local_50._8_4_ =
                 fVar5 * *(float *)&pbVar12->field_0x174 +
                 fVar3 * *(float *)&pbVar12->field_0x154 + fVar4 * *(float *)&pbVar12->field_0x164;
            local_50._12_4_ = 0;
            lVar33 = 0;
            do {
              *(undefined4 *)(lVar31 + lVar33 + -0x10) =
                   *(undefined4 *)((long)(pbVar10->m_contactNormal1).m_floats + lVar33);
              *(undefined4 *)(lVar31 + lVar33) =
                   *(undefined4 *)((long)(pbVar10->m_relpos1CrossNormal).m_floats + lVar33);
              *(undefined4 *)(lVar37 + lVar33 + -0x10) = *(undefined4 *)(local_40 + lVar33);
              *(undefined4 *)(lVar37 + lVar33) = *(undefined4 *)(local_50 + lVar33);
              lVar33 = lVar33 + 4;
            } while (lVar33 != 0xc);
            pfVar8[uVar26 * lVar28 + 3] = 0.0;
            pfVar9[uVar26 * lVar25 + 3] = 0.0;
            pfVar8[uVar26 * lVar28 + 7] = 0.0;
            pfVar9[uVar26 * lVar25 + 7] = 0.0;
            uVar22 = uVar22 + 1;
            uVar26 = uVar26 + 1;
            lVar37 = lVar37 + lVar25 * 4;
            lVar31 = lVar31 + lVar28 * 4;
          } while ((float *)uVar22 != local_c0);
          createMLCPFast::JinvM3.m_setElemOperations =
               createMLCPFast::JinvM3.m_setElemOperations + local_70;
          pbVar35 = local_a8;
          uVar22 = local_a0;
          local_b8 = lVar34;
          local_b0 = lVar23;
          local_6c = createMLCPFast::J3.m_setElemOperations;
        }
      }
      iVar20 = local_f0.m_size;
      iVar27 = (int)local_78;
      if (pbVar13 == (btRigidBody *)0x0) {
        uVar26 = (ulong)(uint)((int)uVar26 + iVar27);
      }
      else {
        if (local_f0.m_size == local_f0.m_capacity) {
          uVar38 = local_f0.m_size * 2;
          if (local_f0.m_size == 0) {
            uVar38 = 1;
          }
          if (local_f0.m_size < (int)uVar38) {
            local_b8 = lVar34;
            local_b0 = lVar23;
            if (uVar38 == 0) {
              pbVar18 = (btJointNode *)0x0;
            }
            else {
              pbVar18 = (btJointNode *)btAlignedAllocInternal((long)(int)uVar38 << 4,0x10);
            }
            if (local_f0.m_size < 1) {
              if (local_f0.m_data != (btJointNode *)0x0) goto LAB_001cf0c8;
            }
            else {
              lVar25 = 0;
              do {
                puVar1 = (undefined8 *)((long)&(local_f0.m_data)->jointIndex + lVar25);
                uVar6 = puVar1[1];
                puVar2 = (undefined8 *)((long)&pbVar18->jointIndex + lVar25);
                *puVar2 = *puVar1;
                puVar2[1] = uVar6;
                lVar25 = lVar25 + 0x10;
              } while ((ulong)(uint)local_f0.m_size << 4 != lVar25);
LAB_001cf0c8:
              if (local_f0.m_ownsMemory == true) {
                btAlignedFreeInternal(local_f0.m_data);
              }
            }
            local_f0.m_ownsMemory = true;
            lVar23 = local_b0;
            lVar34 = local_b8;
            local_f0.m_data = pbVar18;
            local_f0.m_capacity = uVar38;
          }
        }
        lVar25 = (long)iVar20;
        local_f0.m_size = local_f0.m_size + 1;
        pbVar18 = local_f0.m_data + lVar25;
        pbVar18->jointIndex = 0;
        pbVar18->otherBodyIndex = 0;
        pbVar18->nextJointNodeIndex = 0;
        pbVar18->constraintRowIndex = 0;
        iVar21 = local_98.m_data[lVar34];
        local_98.m_data[lVar34] = iVar20;
        local_f0.m_data[lVar25].nextJointNodeIndex = iVar21;
        local_f0.m_data[lVar25].jointIndex = (int)local_d0;
        local_f0.m_data[lVar25].otherBodyIndex =
             -(uint)(pbVar12 == (btRigidBody *)0x0) | (uint)lVar23;
        local_f0.m_data[lVar25].constraintRowIndex = iVar29;
        pfVar9 = createMLCPFast::JinvM3.m_storage.m_data;
        pfVar8 = createMLCPFast::J3.m_storage.m_data;
        iVar27 = (int)local_78;
        uVar22 = local_a0;
        if (0 < iVar27) {
          local_c8 = CONCAT44(local_c8._4_4_,createMLCPFast::JinvM3.m_setElemOperations);
          lVar28 = (long)createMLCPFast::J3.m_cols;
          lVar25 = (long)createMLCPFast::JinvM3.m_cols;
          uVar26 = (ulong)(int)uVar26;
          iVar20 = iVar27 * 8;
          local_b8 = CONCAT44(local_b8._4_4_,iVar20);
          createMLCPFast::J3.m_setElemOperations = createMLCPFast::J3.m_setElemOperations + iVar20;
          local_b0 = CONCAT44(local_b0._4_4_,createMLCPFast::J3.m_setElemOperations);
          local_c0 = (float *)(local_78 & 0xffffffff);
          ppbVar7 = (pbVar35->m_allConstraintPtrArray).m_data;
          lVar23 = (long)createMLCPFast::JinvM3.m_storage.m_data + uVar26 * 4 * lVar25 + 0x10;
          lVar34 = (long)createMLCPFast::J3.m_storage.m_data + uVar26 * 4 * lVar28 + 0x10;
          uVar32 = 0;
          do {
            pbVar10 = ppbVar7[local_60 + uVar32];
            fVar3 = pbVar13->m_inverseMass;
            uVar6 = *(undefined8 *)(pbVar10->m_contactNormal2).m_floats;
            local_40._4_4_ = fVar3 * (float)((ulong)uVar6 >> 0x20);
            local_40._0_4_ = fVar3 * (float)uVar6;
            local_40._8_4_ = fVar3 * (pbVar10->m_contactNormal2).m_floats[2];
            local_40._12_4_ = 0;
            fVar3 = (pbVar10->m_relpos2CrossNormal).m_floats[0];
            fVar4 = (pbVar10->m_relpos2CrossNormal).m_floats[1];
            fVar5 = (pbVar10->m_relpos2CrossNormal).m_floats[2];
            uVar6 = *(undefined8 *)&(pbVar13->super_btCollisionObject).field_0x14c;
            local_50._4_4_ =
                 fVar5 * (float)((ulong)*(undefined8 *)&pbVar13->field_0x16c >> 0x20) +
                 fVar3 * (float)((ulong)uVar6 >> 0x20) +
                 (float)((ulong)*(undefined8 *)&pbVar13->field_0x15c >> 0x20) * fVar4;
            local_50._0_4_ =
                 fVar5 * (float)*(undefined8 *)&pbVar13->field_0x16c +
                 fVar3 * (float)uVar6 + (float)*(undefined8 *)&pbVar13->field_0x15c * fVar4;
            local_50._8_4_ =
                 fVar5 * *(float *)&pbVar13->field_0x174 +
                 fVar3 * *(float *)&pbVar13->field_0x154 + fVar4 * *(float *)&pbVar13->field_0x164;
            local_50._12_4_ = 0;
            lVar31 = 0;
            do {
              *(undefined4 *)(lVar34 + lVar31 + -0x10) =
                   *(undefined4 *)((long)(pbVar10->m_contactNormal2).m_floats + lVar31);
              *(undefined4 *)(lVar34 + lVar31) =
                   *(undefined4 *)((long)(pbVar10->m_relpos2CrossNormal).m_floats + lVar31);
              *(undefined4 *)(lVar23 + lVar31 + -0x10) = *(undefined4 *)(local_40 + lVar31);
              *(undefined4 *)(lVar23 + lVar31) = *(undefined4 *)(local_50 + lVar31);
              lVar31 = lVar31 + 4;
            } while (lVar31 != 0xc);
            pfVar8[uVar26 * lVar28 + 3] = 0.0;
            pfVar9[uVar26 * lVar25 + 3] = 0.0;
            pfVar8[uVar26 * lVar28 + 7] = 0.0;
            pfVar9[uVar26 * lVar25 + 7] = 0.0;
            uVar32 = uVar32 + 1;
            uVar26 = uVar26 + 1;
            lVar23 = lVar23 + lVar25 * 4;
            lVar34 = lVar34 + lVar28 * 4;
          } while ((float *)uVar32 != local_c0);
          createMLCPFast::JinvM3.m_setElemOperations =
               createMLCPFast::JinvM3.m_setElemOperations + iVar20;
          pbVar35 = local_a8;
        }
      }
      iVar21 = (int)uVar22;
      iVar20 = local_64 + iVar27;
      iVar29 = iVar29 + iVar27;
      lVar25 = (long)local_d0 + 1;
    } while (iVar29 < (pbVar35->m_allConstraintPtrArray).m_size);
  }
  CProfileManager::Stop_Profile();
  local_c0 = (float *)0x0;
  local_d0 = (float *)0x0;
  if (createMLCPFast::JinvM3.m_storage.m_size != 0) {
    local_d0 = createMLCPFast::JinvM3.m_storage.m_data;
  }
  if (createMLCPFast::J3.m_storage.m_size != 0) {
    local_c0 = createMLCPFast::J3.m_storage.m_data;
  }
  CProfileManager::Start_Profile("m_A.resize");
  this_00 = &pbVar35->m_A;
  btMatrixX<float>::resize(this_00,iVar21,iVar21);
  CProfileManager::Stop_Profile();
  CProfileManager::Start_Profile("m_A.setZero");
  btMatrixX<float>::setZero(this_00);
  CProfileManager::Stop_Profile();
  CProfileManager::Start_Profile("Compute A");
  if (0 < (pbVar35->m_allConstraintPtrArray).m_size) {
    lVar25 = 0;
    iVar20 = 0;
    do {
      uVar38 = uVar15;
      if (iVar20 < (pbVar35->super_btSequentialImpulseConstraintSolver).
                   m_tmpSolverNonContactConstraintPool.m_size) {
        uVar38 = (pbVar35->super_btSequentialImpulseConstraintSolver).m_tmpConstraintSizesPool.
                 m_data[lVar25].m_numConstraintRows;
      }
      iVar29 = createMLCPFast::ofs.m_data[lVar25];
      pbVar10 = (pbVar35->m_allConstraintPtrArray).m_data[iVar20];
      iVar21 = pbVar10->m_solverBodyIdA;
      local_c8 = (long)pbVar10->m_solverBodyIdB;
      pbVar36 = local_d0 + (long)iVar29 * 0x10;
      pbVar18 = local_f0.m_data;
      pbVar24 = local_f0.m_data;
      for (uVar16 = local_98.m_data[iVar21]; local_f0.m_data = pbVar24, -1 < (int)uVar16;
          uVar16 = pbVar18[uVar16].nextJointNodeIndex) {
        lVar23 = (long)pbVar18[uVar16].jointIndex;
        if (lVar23 < lVar25) {
          uVar30 = uVar15;
          if (pbVar18[uVar16].constraintRowIndex <
              (local_a8->super_btSequentialImpulseConstraintSolver).
              m_tmpSolverNonContactConstraintPool.m_size) {
            uVar30 = (local_a8->super_btSequentialImpulseConstraintSolver).m_tmpConstraintSizesPool.
                     m_data[lVar23].m_numConstraintRows;
          }
          if ((local_a8->m_allConstraintPtrArray).m_data[pbVar18[uVar16].constraintRowIndex]->
              m_solverBodyIdB == iVar21) {
            iVar27 = uVar30 * 8;
          }
          else {
            iVar27 = 0;
          }
          btMatrixX<float>::multiplyAdd2_p8r
                    (this_00,pbVar36,
                     local_c0 + (long)createMLCPFast::ofs.m_data[lVar23] * 0x10 + (long)iVar27,
                     uVar38,uVar30,iVar29,createMLCPFast::ofs.m_data[lVar23]);
          pbVar18 = local_f0.m_data;
        }
        pbVar35 = local_a8;
        pbVar24 = local_f0.m_data;
      }
      uVar16 = local_98.m_data[local_c8];
      if (-1 < (int)uVar16) {
        do {
          lVar23 = (long)pbVar24[uVar16].jointIndex;
          if (lVar23 < lVar25) {
            uVar30 = uVar15;
            if (pbVar24[uVar16].constraintRowIndex <
                (pbVar35->super_btSequentialImpulseConstraintSolver).
                m_tmpSolverNonContactConstraintPool.m_size) {
              uVar30 = (pbVar35->super_btSequentialImpulseConstraintSolver).m_tmpConstraintSizesPool
                       .m_data[lVar23].m_numConstraintRows;
            }
            if ((pbVar35->m_allConstraintPtrArray).m_data[pbVar24[uVar16].constraintRowIndex]->
                m_solverBodyIdB == (int)local_c8) {
              iVar21 = uVar30 * 8;
            }
            else {
              iVar21 = 0;
            }
            btMatrixX<float>::multiplyAdd2_p8r
                      (this_00,pbVar36 + (long)(int)uVar38 * 8,
                       local_c0 + (long)createMLCPFast::ofs.m_data[lVar23] * 0x10 + (long)iVar21,
                       uVar38,uVar30,iVar29,createMLCPFast::ofs.m_data[lVar23]);
            pbVar24 = local_f0.m_data;
          }
          uVar16 = pbVar24[uVar16].nextJointNodeIndex;
        } while (-1 < (int)uVar16);
      }
      iVar20 = iVar20 + uVar38;
      lVar25 = lVar25 + 1;
    } while (iVar20 < (pbVar35->m_allConstraintPtrArray).m_size);
  }
  CProfileManager::Start_Profile("compute diagonal");
  iVar20 = (pbVar35->m_allConstraintPtrArray).m_size;
  local_c8 = CONCAT44(local_c8._4_4_,iVar20);
  if (0 < iVar20) {
    lVar25 = 0;
    iVar20 = 0;
    do {
      uVar38 = uVar15;
      if (iVar20 < (local_a8->super_btSequentialImpulseConstraintSolver).
                   m_tmpSolverNonContactConstraintPool.m_size) {
        uVar38 = *(uint *)((long)&((local_a8->super_btSequentialImpulseConstraintSolver).
                                   m_tmpConstraintSizesPool.m_data)->m_numConstraintRows + lVar25);
      }
      lVar23 = (long)iVar20;
      pbVar12 = (local_a8->super_btSequentialImpulseConstraintSolver).m_tmpSolverBodyPool.m_data
                [(local_a8->m_allConstraintPtrArray).m_data[lVar23]->m_solverBodyIdB].m_originalBody
      ;
      pbVar36 = local_d0 + lVar23 * 0x10;
      C = local_c0 + lVar23 * 0x10;
      btMatrixX<float>::multiply2_p8r(this_00,pbVar36,C,uVar38,uVar38,iVar20,iVar20);
      if (pbVar12 != (btRigidBody *)0x0) {
        btMatrixX<float>::multiplyAdd2_p8r
                  (this_00,pbVar36 + (ulong)uVar38 * 8,C + (ulong)uVar38 * 8,uVar38,uVar38,iVar20,
                   iVar20);
      }
      iVar20 = iVar20 + uVar38;
      lVar25 = lVar25 + 8;
    } while (iVar20 < (int)local_c8);
  }
  CProfileManager::Stop_Profile();
  CProfileManager::Stop_Profile();
  pbVar14 = local_58;
  uVar22 = local_a0;
  pbVar35 = local_a8;
  iVar20 = this_00->m_rows;
  lVar25 = (long)iVar20;
  if (0 < lVar25) {
    iVar29 = (local_a8->m_A).m_cols;
    iVar21 = (local_a8->m_A).m_setElemOperations;
    pfVar8 = (local_a8->m_A).m_storage.m_data;
    iVar27 = 0;
    do {
      pfVar8[iVar27] =
           local_a8->m_cfm / (local_58->super_btContactSolverInfoData).m_timeStep + pfVar8[iVar27];
      iVar27 = iVar27 + iVar29 + 1;
      lVar25 = lVar25 + -1;
    } while (lVar25 != 0);
    (local_a8->m_A).m_setElemOperations = iVar20 + iVar21;
  }
  CProfileManager::Start_Profile("fill the upper triangle ");
  btMatrixX<float>::copyLowerToUpperTriangle(this_00);
  CProfileManager::Stop_Profile();
  CProfileManager::Start_Profile("resize/init x");
  btVectorX<float>::resize(&pbVar35->m_x,(int)uVar22);
  btVectorX<float>::resize(&pbVar35->m_xSplit,(int)uVar22);
  if (((pbVar14->super_btContactSolverInfoData).m_solverMode & 4) == 0) {
    lVar25 = (long)(pbVar35->m_x).m_storage.m_size;
    if (lVar25 != 0) {
      memset((pbVar35->m_x).m_storage.m_data,0,lVar25 << 2);
    }
    lVar25 = (long)(pbVar35->m_xSplit).m_storage.m_size;
    if (lVar25 != 0) {
      memset((pbVar35->m_xSplit).m_storage.m_data,0,lVar25 << 2);
    }
  }
  else {
    lVar25 = (long)(pbVar35->m_allConstraintPtrArray).m_size;
    if (0 < lVar25) {
      ppbVar7 = (pbVar35->m_allConstraintPtrArray).m_data;
      pfVar8 = (pbVar35->m_x).m_storage.m_data;
      pfVar9 = (pbVar35->m_xSplit).m_storage.m_data;
      lVar23 = 0;
      do {
        pbVar10 = ppbVar7[lVar23];
        pfVar8[lVar23] = pbVar10->m_appliedImpulse;
        pfVar9[lVar23] = pbVar10->m_appliedPushImpulse;
        lVar23 = lVar23 + 1;
      } while (lVar25 != lVar23);
    }
  }
  CProfileManager::Stop_Profile();
  btAlignedObjectArray<btJointNode>::~btAlignedObjectArray(&local_f0);
  btAlignedObjectArray<int>::~btAlignedObjectArray(&local_98);
  return;
}

Assistant:

void btMLCPSolver::createMLCPFast(const btContactSolverInfo& infoGlobal)
{
	int numContactRows = interleaveContactAndFriction ? 3 : 1;

	int numConstraintRows = m_allConstraintPtrArray.size();
	int n = numConstraintRows;
	{
		BT_PROFILE("init b (rhs)");
		m_b.resize(numConstraintRows);
		m_bSplit.resize(numConstraintRows);
		m_b.setZero();
		m_bSplit.setZero();
		for (int i=0;i<numConstraintRows ;i++)
		{
			btScalar jacDiag = m_allConstraintPtrArray[i]->m_jacDiagABInv;
			if (!btFuzzyZero(jacDiag))
			{
				btScalar rhs = m_allConstraintPtrArray[i]->m_rhs;
				btScalar rhsPenetration = m_allConstraintPtrArray[i]->m_rhsPenetration;
				m_b[i]=rhs/jacDiag;
				m_bSplit[i] = rhsPenetration/jacDiag;
			}

		}
	}

//	btScalar* w = 0;
//	int nub = 0;

	m_lo.resize(numConstraintRows);
	m_hi.resize(numConstraintRows);
 
	{
		BT_PROFILE("init lo/ho");

		for (int i=0;i<numConstraintRows;i++)
		{
			if (0)//m_limitDependencies[i]>=0)
			{
				m_lo[i] = -BT_INFINITY;
				m_hi[i] = BT_INFINITY;
			} else
			{
				m_lo[i] = m_allConstraintPtrArray[i]->m_lowerLimit;
				m_hi[i] = m_allConstraintPtrArray[i]->m_upperLimit;
			}
		}
	}

	//
	int m=m_allConstraintPtrArray.size();

	int numBodies = m_tmpSolverBodyPool.size();
	btAlignedObjectArray<int> bodyJointNodeArray;
	{
		BT_PROFILE("bodyJointNodeArray.resize");
		bodyJointNodeArray.resize(numBodies,-1);
	}
	btAlignedObjectArray<btJointNode> jointNodeArray;
	{
		BT_PROFILE("jointNodeArray.reserve");
		jointNodeArray.reserve(2*m_allConstraintPtrArray.size());
	}

	static btMatrixXu J3;
	{
		BT_PROFILE("J3.resize");
		J3.resize(2*m,8);
	}
	static btMatrixXu JinvM3;
	{
		BT_PROFILE("JinvM3.resize/setZero");

		JinvM3.resize(2*m,8);
		JinvM3.setZero();
		J3.setZero();
	}
	int cur=0;
	int rowOffset = 0;
	static btAlignedObjectArray<int> ofs;
	{
		BT_PROFILE("ofs resize");
		ofs.resize(0);
		ofs.resizeNoInitialize(m_allConstraintPtrArray.size());
	}				
	{
		BT_PROFILE("Compute J and JinvM");
		int c=0;

		int numRows = 0;

		for (int i=0;i<m_allConstraintPtrArray.size();i+=numRows,c++)
		{
			ofs[c] = rowOffset;
			int sbA = m_allConstraintPtrArray[i]->m_solverBodyIdA;
			int sbB = m_allConstraintPtrArray[i]->m_solverBodyIdB;
			btRigidBody* orgBodyA = m_tmpSolverBodyPool[sbA].m_originalBody;
			btRigidBody* orgBodyB = m_tmpSolverBodyPool[sbB].m_originalBody;

			numRows = i<m_tmpSolverNonContactConstraintPool.size() ? m_tmpConstraintSizesPool[c].m_numConstraintRows : numContactRows ;
			if (orgBodyA)
			{
				{
					int slotA=-1;
					//find free jointNode slot for sbA
					slotA =jointNodeArray.size();
					jointNodeArray.expand();//NonInitializing();
					int prevSlot = bodyJointNodeArray[sbA];
					bodyJointNodeArray[sbA] = slotA;
					jointNodeArray[slotA].nextJointNodeIndex = prevSlot;
					jointNodeArray[slotA].jointIndex = c;
					jointNodeArray[slotA].constraintRowIndex = i;
					jointNodeArray[slotA].otherBodyIndex = orgBodyB ? sbB : -1;
				}
				for (int row=0;row<numRows;row++,cur++)
				{
					btVector3 normalInvMass =				m_allConstraintPtrArray[i+row]->m_contactNormal1 *		orgBodyA->getInvMass();
					btVector3 relPosCrossNormalInvInertia = m_allConstraintPtrArray[i+row]->m_relpos1CrossNormal *	orgBodyA->getInvInertiaTensorWorld();

					for (int r=0;r<3;r++)
					{
						J3.setElem(cur,r,m_allConstraintPtrArray[i+row]->m_contactNormal1[r]);
						J3.setElem(cur,r+4,m_allConstraintPtrArray[i+row]->m_relpos1CrossNormal[r]);
						JinvM3.setElem(cur,r,normalInvMass[r]);
						JinvM3.setElem(cur,r+4,relPosCrossNormalInvInertia[r]);
					}
					J3.setElem(cur,3,0);
					JinvM3.setElem(cur,3,0);
					J3.setElem(cur,7,0);
					JinvM3.setElem(cur,7,0);
				}
			} else
			{
				cur += numRows;
			}
			if (orgBodyB)
			{

				{
					int slotB=-1;
					//find free jointNode slot for sbA
					slotB =jointNodeArray.size();
					jointNodeArray.expand();//NonInitializing();
					int prevSlot = bodyJointNodeArray[sbB];
					bodyJointNodeArray[sbB] = slotB;
					jointNodeArray[slotB].nextJointNodeIndex = prevSlot;
					jointNodeArray[slotB].jointIndex = c;
					jointNodeArray[slotB].otherBodyIndex = orgBodyA ? sbA : -1;
					jointNodeArray[slotB].constraintRowIndex = i;
				}

				for (int row=0;row<numRows;row++,cur++)
				{
					btVector3 normalInvMassB = m_allConstraintPtrArray[i+row]->m_contactNormal2*orgBodyB->getInvMass();
					btVector3 relPosInvInertiaB = m_allConstraintPtrArray[i+row]->m_relpos2CrossNormal * orgBodyB->getInvInertiaTensorWorld();

					for (int r=0;r<3;r++)
					{
						J3.setElem(cur,r,m_allConstraintPtrArray[i+row]->m_contactNormal2[r]);
						J3.setElem(cur,r+4,m_allConstraintPtrArray[i+row]->m_relpos2CrossNormal[r]);
						JinvM3.setElem(cur,r,normalInvMassB[r]);
						JinvM3.setElem(cur,r+4,relPosInvInertiaB[r]);
					}
					J3.setElem(cur,3,0);
					JinvM3.setElem(cur,3,0);
					J3.setElem(cur,7,0);
					JinvM3.setElem(cur,7,0);
				}
			}
			else
			{
				cur += numRows;
			}
			rowOffset+=numRows;

		}
		
	}


	//compute JinvM = J*invM.
	const btScalar* JinvM = JinvM3.getBufferPointer();

	const btScalar* Jptr = J3.getBufferPointer();
	{
		BT_PROFILE("m_A.resize");
		m_A.resize(n,n);
	}
	
	{
		BT_PROFILE("m_A.setZero");
		m_A.setZero();
	}
	int c=0;
	{
		int numRows = 0;
		BT_PROFILE("Compute A");
		for (int i=0;i<m_allConstraintPtrArray.size();i+= numRows,c++)
		{
			int row__ = ofs[c];
			int sbA = m_allConstraintPtrArray[i]->m_solverBodyIdA;
			int sbB = m_allConstraintPtrArray[i]->m_solverBodyIdB;
		//	btRigidBody* orgBodyA = m_tmpSolverBodyPool[sbA].m_originalBody;
		//	btRigidBody* orgBodyB = m_tmpSolverBodyPool[sbB].m_originalBody;

			numRows = i<m_tmpSolverNonContactConstraintPool.size() ? m_tmpConstraintSizesPool[c].m_numConstraintRows : numContactRows ;
					
			const btScalar *JinvMrow = JinvM + 2*8*(size_t)row__;

			{
				int startJointNodeA = bodyJointNodeArray[sbA];
				while (startJointNodeA>=0)
				{
					int j0 = jointNodeArray[startJointNodeA].jointIndex;
					int cr0 = jointNodeArray[startJointNodeA].constraintRowIndex;
					if (j0<c)
					{
								 
						int numRowsOther = cr0 < m_tmpSolverNonContactConstraintPool.size() ? m_tmpConstraintSizesPool[j0].m_numConstraintRows : numContactRows;
						size_t ofsother = (m_allConstraintPtrArray[cr0]->m_solverBodyIdB == sbA) ? 8*numRowsOther  : 0;
						//printf("%d joint i %d and j0: %d: ",count++,i,j0);
						m_A.multiplyAdd2_p8r ( JinvMrow, 
						Jptr + 2*8*(size_t)ofs[j0] + ofsother, numRows, numRowsOther,  row__,ofs[j0]);
					}
					startJointNodeA = jointNodeArray[startJointNodeA].nextJointNodeIndex;
				}
			}

			{
				int startJointNodeB = bodyJointNodeArray[sbB];
				while (startJointNodeB>=0)
				{
					int j1 = jointNodeArray[startJointNodeB].jointIndex;
					int cj1 = jointNodeArray[startJointNodeB].constraintRowIndex;

					if (j1<c)
					{
						int numRowsOther =  cj1 < m_tmpSolverNonContactConstraintPool.size() ? m_tmpConstraintSizesPool[j1].m_numConstraintRows : numContactRows;
						size_t ofsother = (m_allConstraintPtrArray[cj1]->m_solverBodyIdB == sbB) ? 8*numRowsOther  : 0;
						m_A.multiplyAdd2_p8r ( JinvMrow + 8*(size_t)numRows, 
						Jptr + 2*8*(size_t)ofs[j1] + ofsother, numRows, numRowsOther, row__,ofs[j1]);
					}
					startJointNodeB = jointNodeArray[startJointNodeB].nextJointNodeIndex;
				}
			}
		}

		{
			BT_PROFILE("compute diagonal");
			// compute diagonal blocks of m_A

			int  row__ = 0;
			int numJointRows = m_allConstraintPtrArray.size();

			int jj=0;
			for (;row__<numJointRows;)
			{

				//int sbA = m_allConstraintPtrArray[row__]->m_solverBodyIdA;
				int sbB = m_allConstraintPtrArray[row__]->m_solverBodyIdB;
			//	btRigidBody* orgBodyA = m_tmpSolverBodyPool[sbA].m_originalBody;
				btRigidBody* orgBodyB = m_tmpSolverBodyPool[sbB].m_originalBody;


				const unsigned int infom =  row__ < m_tmpSolverNonContactConstraintPool.size() ? m_tmpConstraintSizesPool[jj].m_numConstraintRows : numContactRows;
				
				const btScalar *JinvMrow = JinvM + 2*8*(size_t)row__;
				const btScalar *Jrow = Jptr + 2*8*(size_t)row__;
				m_A.multiply2_p8r (JinvMrow, Jrow, infom, infom, row__,row__);
				if (orgBodyB) 
				{
					m_A.multiplyAdd2_p8r (JinvMrow + 8*(size_t)infom, Jrow + 8*(size_t)infom, infom, infom,  row__,row__);
				}
				row__ += infom;
				jj++;
			}
		}
	}

	if (1)
	{
		// add cfm to the diagonal of m_A
		for ( int i=0; i<m_A.rows(); ++i) 
		{
			m_A.setElem(i,i,m_A(i,i)+ m_cfm / infoGlobal.m_timeStep);
		}
	}
				   
	///fill the upper triangle of the matrix, to make it symmetric
	{
		BT_PROFILE("fill the upper triangle ");
		m_A.copyLowerToUpperTriangle();
	}

	{
		BT_PROFILE("resize/init x");
		m_x.resize(numConstraintRows);
		m_xSplit.resize(numConstraintRows);

		if (infoGlobal.m_solverMode&SOLVER_USE_WARMSTARTING)
		{
			for (int i=0;i<m_allConstraintPtrArray.size();i++)
			{
				const btSolverConstraint& c = *m_allConstraintPtrArray[i];
				m_x[i]=c.m_appliedImpulse;
				m_xSplit[i] = c.m_appliedPushImpulse;
			}
		} else
		{
			m_x.setZero();
			m_xSplit.setZero();
		}
	}

}